

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

LY_ERR yin_parse_mod(lysp_yin_ctx *ctx,lysp_module *mod)

{
  lysp_node **pplVar1;
  lys_module *plVar2;
  lysp_ext_instance *object;
  yin_subelement *subelems_00;
  LY_ERR LVar3;
  lysp_submodule *plVar4;
  ly_ctx *ctx_00;
  LY_ERR ret__;
  yin_subelement *subelems;
  lysp_node_action **local_b8;
  lysp_revision **local_b0;
  char **local_a8;
  char **local_a0;
  char **local_98;
  lysp_node_notif **local_90;
  char **local_88;
  lysp_include **local_80;
  lysp_import **local_78;
  lysp_ident **local_70;
  lysp_node_grp **local_68;
  lysp_feature **local_60;
  lysp_ext **local_58;
  lysp_deviation **local_50;
  char **local_48;
  char **local_40;
  lysp_node_augment **local_38;
  
  subelems = (yin_subelement *)0x0;
  mod->field_0x79 = mod->field_0x79 & 0xfd;
  LVar3 = lyxml_ctx_next(ctx->xmlctx);
  if ((LVar3 == LY_SUCCESS) &&
     (LVar3 = yin_parse_attribute(ctx,YIN_ARG_NAME,&mod->mod->name,Y_IDENTIF_ARG,LY_STMT_MODULE),
     LVar3 == LY_SUCCESS)) {
    pplVar1 = &mod->data;
    local_38 = &mod->augments;
    plVar2 = mod->mod;
    local_40 = &plVar2->contact;
    local_48 = &plVar2->dsc;
    local_50 = &mod->deviations;
    local_58 = &mod->extensions;
    local_60 = &mod->features;
    local_68 = &mod->groupings;
    local_70 = &mod->identities;
    local_a0 = &plVar2->prefix;
    local_78 = &mod->imports;
    local_80 = &mod->includes;
    local_88 = &plVar2->ns;
    local_90 = &mod->notifs;
    local_98 = &plVar2->org;
    local_a8 = &plVar2->ref;
    local_b0 = &mod->revs;
    local_b8 = &mod->rpcs;
    LVar3 = subelems_allocator(ctx,0x1c,(lysp_node *)0x0,&subelems,0x20,pplVar1,8,0x40,pplVar1,0,
                               0x80,local_38,0,0x200,pplVar1,0,0x60000,local_40,2,0x400,pplVar1,0,
                               0x80000,local_48,2,0xa0000,local_50,0,0xe0000,local_58,0,0x100000,
                               local_60,0,0x800,local_68,0,0x120000,local_70,0,0x140000,
                               plVar2->prefix,local_78,0,0x150000,plVar2->name,local_80,0,0x1000,
                               pplVar1,0,0x2000,pplVar1,0,0x4000,pplVar1,0,0x1e0000,local_88,3,1,
                               local_90,0,0x200000,local_98,2,0x240000,local_a0);
    subelems_00 = subelems;
    if (LVar3 == LY_SUCCESS) {
      LVar3 = yin_parse_content(ctx,subelems,0x1c,mod,LY_STMT_MODULE,(char **)0x0,&mod->exts);
      subelems_deallocator(0x1c,subelems_00);
      if (LVar3 == LY_SUCCESS) {
        object = mod->exts;
        LVar3 = LY_SUCCESS;
        if (object != (lysp_ext_instance *)0x0) {
          LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0);
        }
        if (LVar3 == LY_SUCCESS) {
          plVar4 = ly_ctx_get_submodule_latest(ctx->xmlctx->ctx,mod->mod->name);
          if (plVar4 == (lysp_submodule *)0x0) {
            LVar3 = LY_SUCCESS;
          }
          else {
            if (ctx == (lysp_yin_ctx *)0x0) {
              ctx_00 = (ly_ctx *)0x0;
            }
            else {
              ctx_00 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            ly_vlog(ctx_00,(char *)0x0,LYVE_SEMANTICS,
                    "Name collision between %s and %s of name \"%s\".","module","submodule",
                    mod->mod->name);
            LVar3 = LY_EVALID;
          }
        }
      }
    }
  }
  return LVar3;
}

Assistant:

LY_ERR
yin_parse_mod(struct lysp_yin_ctx *ctx, struct lysp_module *mod)
{
    LY_ERR ret = LY_SUCCESS;
    struct yin_subelement *subelems = NULL;
    const struct lysp_submodule *dup;
    size_t subelems_size;

    mod->is_submod = 0;

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &mod->mod->name, Y_IDENTIF_ARG, LY_STMT_MODULE));
    LY_CHECK_RET(subelems_allocator(ctx, subelems_size = 28, NULL, &subelems,
            LY_STMT_ANYDATA, &mod->data, YIN_SUBELEM_VER2,
            LY_STMT_ANYXML, &mod->data, 0,
            LY_STMT_AUGMENT, &mod->augments, 0,
            LY_STMT_CHOICE, &mod->data, 0,
            LY_STMT_CONTACT, &mod->mod->contact, YIN_SUBELEM_UNIQUE,
            LY_STMT_CONTAINER, &mod->data, 0,
            LY_STMT_DESCRIPTION, &mod->mod->dsc, YIN_SUBELEM_UNIQUE,
            LY_STMT_DEVIATION, &mod->deviations, 0,
            LY_STMT_EXTENSION, &mod->extensions, 0,
            LY_STMT_FEATURE, &mod->features, 0,
            LY_STMT_GROUPING, &mod->groupings, 0,
            LY_STMT_IDENTITY, &mod->identities, 0,
            LY_STMT_IMPORT, mod->mod->prefix, &mod->imports, 0,
            LY_STMT_INCLUDE, mod->mod->name, &mod->includes, 0,
            LY_STMT_LEAF, &mod->data, 0,
            LY_STMT_LEAF_LIST, &mod->data, 0,
            LY_STMT_LIST, &mod->data, 0,
            LY_STMT_NAMESPACE, &mod->mod->ns, YIN_SUBELEM_MANDATORY | YIN_SUBELEM_UNIQUE,
            LY_STMT_NOTIFICATION, &mod->notifs, 0,
            LY_STMT_ORGANIZATION, &mod->mod->org, YIN_SUBELEM_UNIQUE,
            LY_STMT_PREFIX, &mod->mod->prefix, YIN_SUBELEM_MANDATORY | YIN_SUBELEM_UNIQUE,
            LY_STMT_REFERENCE, &mod->mod->ref, YIN_SUBELEM_UNIQUE,
            LY_STMT_REVISION, &mod->revs, 0,
            LY_STMT_RPC, &mod->rpcs, 0,
            LY_STMT_TYPEDEF, &mod->typedefs, 0,
            LY_STMT_USES, &mod->data, 0,
            LY_STMT_YANG_VERSION, &mod->version, YIN_SUBELEM_UNIQUE,
            LY_STMT_EXTENSION_INSTANCE, NULL, 0));

    ret = yin_parse_content(ctx, subelems, subelems_size, mod, LY_STMT_MODULE, NULL, &mod->exts);
    subelems_deallocator(subelems_size, subelems);
    LY_CHECK_RET(ret);

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, mod->exts));

    /* submodules share the namespace with the module names, so there must not be
     * a submodule of the same name in the context, no need for revision matching */
    dup = ly_ctx_get_submodule_latest(ctx->xmlctx->ctx, mod->mod->name);
    if (dup) {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_NAME2_COL, "module", "submodule", mod->mod->name);
        return LY_EVALID;
    }

    return LY_SUCCESS;
}